

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall
glslang::TReflectionTraverser::blowUpActiveAggregate
          (TReflectionTraverser *this,TType *baseType,TString *baseName,
          TList<glslang::TIntermBinary_*> *derefs,const_iterator deref,int offset,int blockIndex,
          int arraySize,int topLevelArraySize,int topLevelArrayStride,TStorageQualifier baseStorage,
          bool active)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  EShLanguageMask *pEVar2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  TReflection *pTVar5;
  pointer pTVar6;
  iterator __position;
  bool bVar7;
  char cVar8;
  int iVar9;
  TStorageQualifier baseStorage_00;
  int iVar10;
  uint uVar11;
  int iVar12;
  EShReflectionOptions EVar13;
  undefined4 extraout_var;
  _List_node_header *deref_00;
  TType *type;
  iterator iVar14;
  long lVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar16;
  TType *pTVar17;
  size_t sVar18;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar19;
  mapped_type *pmVar20;
  void *__child_stack;
  int i;
  uint uVar21;
  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *this_00;
  ulong uVar22;
  long lVar23;
  TType *this_01;
  allocator_type __fn;
  const_iterator __arg;
  long lVar24;
  bool bVar25;
  int local_268;
  TString newBaseName_2;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_210;
  int local_1e8;
  uint local_1e4;
  TString name;
  TString newBaseName;
  TArraySizes *local_140;
  char text [16];
  size_type local_f8;
  undefined1 local_f0 [24];
  char text_1 [16];
  TString newBaseName_1;
  
  EVar13 = this->reflection->options;
  __arg._M_node = deref._M_node;
  iVar9 = (*baseType->_vptr_TType[7])(baseType);
  if (iVar9 == 0x10) {
    iVar9 = (*baseType->_vptr_TType[0xb])(baseType);
    bVar25 = (*(uint *)(CONCAT44(extraout_var,iVar9) + 8) & 0x7f) == 6;
  }
  else {
    bVar25 = false;
  }
  name._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  pcVar3 = (baseName->_M_dataplus)._M_p;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &name,pcVar3,pcVar3 + baseName->_M_string_length);
  deref_00 = &(derefs->
              super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ).
              super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ._M_impl._M_node;
  type = baseType;
  if (deref_00 != (_List_node_header *)deref._M_node) {
    do {
      p_Var4 = deref._M_node[1]._M_next;
      type = (TType *)(*(code *)p_Var4->_M_next[0xf]._M_next)(p_Var4);
      iVar9 = *(int *)&p_Var4[0xb]._M_prev;
      if (iVar9 == 0x33) {
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
        pTVar17 = (TType *)(**(code **)(*plVar16 + 0xf0))(plVar16);
        iVar9 = getArrayStride(this,baseType,pTVar17);
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_prev)(p_Var4);
        lVar23 = (**(code **)(*plVar16 + 0x28))(plVar16);
        uVar21 = **(uint **)(*(long *)(lVar23 + 0xc0) + 8);
        iVar10 = (*type->_vptr_TType[7])(type);
        if (iVar10 != 0x10) {
          if ((EVar13 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
            iVar10 = (*baseType->_vptr_TType[7])();
            if (iVar10 != 0x10) goto LAB_003740af;
          }
          else if (bVar25) {
            newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &newBaseName,"[0]","");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
          }
          else {
LAB_003740af:
            newBaseName_2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &newBaseName_2,"[","");
            snprintf(text,0x10,"%d",(ulong)uVar21);
            local_210._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            sVar18 = strlen(text);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_210,text,text + sVar18);
            pbVar19 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      _M_append(&newBaseName_2,local_210._M_dataplus._M_p,local_210._M_string_length
                               );
            newBaseName_1._M_dataplus.super_allocator_type.allocator =
                 (pbVar19->_M_dataplus).super_allocator_type.allocator;
            newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
            pcVar3 = (pbVar19->_M_dataplus)._M_p;
            paVar1 = &pbVar19->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                 *)pcVar3 == paVar1) {
              newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName_1.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
            }
            else {
              newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName_1._M_dataplus._M_p = pcVar3;
            }
            newBaseName_1._M_string_length = pbVar19->_M_string_length;
            (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar19->_M_string_length = 0;
            (pbVar19->field_2)._M_local_buf[0] = '\0';
            pbVar19 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      append(&newBaseName_1,"]");
            newBaseName._M_dataplus.super_allocator_type.allocator =
                 (pbVar19->_M_dataplus).super_allocator_type.allocator;
            newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
            pcVar3 = (pbVar19->_M_dataplus)._M_p;
            paVar1 = &pbVar19->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                 *)pcVar3 == paVar1) {
              newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
            }
            else {
              newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName._M_dataplus._M_p = pcVar3;
            }
            newBaseName._M_string_length = pbVar19->_M_string_length;
            (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar19->_M_string_length = 0;
            (pbVar19->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
            if (-1 < offset) {
              offset = offset + uVar21 * iVar9;
            }
          }
        }
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = iVar9;
        }
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = 0;
        }
        else {
          plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
          pTVar17 = (TType *)(**(code **)(*plVar16 + 0xf0))(plVar16);
LAB_00374274:
          iVar9 = (*pTVar17->_vptr_TType[0x1d])();
          if ((char)iVar9 != '\0') {
            bVar25 = false;
          }
        }
      }
      else if (iVar9 == 0x35) {
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_prev)(p_Var4);
        lVar23 = (**(code **)(*plVar16 + 0x28))(plVar16);
        iVar9 = **(int **)(*(long *)(lVar23 + 0xc0) + 8);
        if (-1 < offset) {
          plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
          pTVar17 = (TType *)(**(code **)(*plVar16 + 0xf0))(plVar16);
          iVar10 = TIntermediate::getOffset(pTVar17,iVar9);
          offset = offset + iVar10;
        }
        if (name._M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&name,".");
        }
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
        plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))(plVar16);
        cVar8 = (**(code **)(*plVar16 + 0x128))(plVar16);
        if (cVar8 == '\0') goto LAB_003750a7;
        lVar23 = (**(code **)(**(long **)(*(long *)(plVar16[0xd] + 8) + (long)iVar9 * 0x20) + 0x30))
                           ();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(&name,*(char **)(lVar23 + 8),*(size_type *)(lVar23 + 0x10));
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
        plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))(plVar16);
        iVar9 = (**(code **)(*plVar16 + 0x38))(plVar16);
        pTVar17 = type;
        if (iVar9 != 0x10) goto LAB_00374274;
      }
      else if (iVar9 == 0x34) {
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
        pTVar17 = (TType *)(**(code **)(*plVar16 + 0xf0))(plVar16);
        iVar9 = getArrayStride(this,baseType,pTVar17);
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = iVar9;
        }
        plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
        plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))(plVar16);
        (**(code **)(*plVar16 + 0x78))(plVar16);
        uVar22 = 0;
        goto LAB_003748f3;
      }
      deref._M_node = (deref._M_node)->_M_next;
    } while ((_List_node_header *)deref._M_node != deref_00);
  }
  bVar7 = isReflectionGranularity(this,type);
  if (bVar7) {
    if (((this->reflection->options & EShReflectionBasicArraySuffix) != EShReflectionDefault) &&
       (iVar9 = (*type->_vptr_TType[0x1d])(type), (char)iVar9 != '\0')) {
      newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &newBaseName,"[0]","");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
    }
    if (arraySize == 0) {
      iVar9 = (*type->_vptr_TType[0x1d])(type);
      arraySize = 1;
      if ((char)iVar9 != '\0') {
        arraySize = (*type->_vptr_TType[0xf])(type);
      }
    }
    pTVar5 = this->reflection;
    lVar23 = 0x128;
    if ((pTVar5->options & EShReflectionSeparateBuffers) == EShReflectionDefault) {
      lVar23 = 0xf8;
    }
    if (baseStorage != EvqBuffer) {
      lVar23 = 0xf8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1);
    iVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(pTVar5->nameToIndex)._M_t,(key_type *)&newBaseName);
    if (newBaseName._M_dataplus.super_allocator_type.allocator !=
        (TPoolAllocator *)&newBaseName._M_string_length) {
      operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                      newBaseName._M_string_length + 1);
    }
    this_00 = (vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *)
              ((long)&pTVar5->_vptr_TReflection + lVar23);
    pTVar5 = this->reflection;
    if ((_Rb_tree_header *)iVar14._M_node !=
        &(pTVar5->nameToIndex)._M_t._M_impl.super__Rb_tree_header) {
      if (1 < arraySize) {
        pTVar6 = (this_00->
                 super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar9 = pTVar6[(int)iVar14._M_node[2]._M_color].size;
        if (iVar9 < arraySize) {
          iVar9 = arraySize;
        }
        pTVar6[(int)iVar14._M_node[2]._M_color].size = iVar9;
      }
      if (!active || (pTVar5->options & EShReflectionAllBlockVariables) == EShReflectionDefault) {
        return;
      }
      pEVar2 = &(this_00->
                super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                )._M_impl.super__Vector_impl_data._M_start[(int)iVar14._M_node[2]._M_color].stages;
      *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
      return;
    }
    iVar9 = (int)((ulong)((long)(this_00->
                                super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->
                               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
    newBaseName_2._M_dataplus.super_allocator_type.allocator._0_4_ = iVar9;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&pTVar5->nameToIndex,(key_type *)&newBaseName);
    *pmVar20 = iVar9;
    if (newBaseName._M_dataplus.super_allocator_type.allocator !=
        (TPoolAllocator *)&newBaseName._M_string_length) {
      operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                      newBaseName._M_string_length + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newBaseName_1,name._M_dataplus._M_p,(allocator<char> *)&local_210);
    iVar10 = mapToGlType(this,type);
    newBaseName._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&newBaseName._M_string_length;
    __fn = newBaseName_1._M_dataplus.super_allocator_type;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&newBaseName,newBaseName_1._M_dataplus.super_allocator_type.allocator,
               newBaseName_1._M_dataplus._M_p +
               (long)newBaseName_1._M_dataplus.super_allocator_type.allocator);
    newBaseName.field_2._12_4_ = iVar10;
    newBaseName.field_2._8_4_ = offset;
    TType::clone(type,(__fn *)__fn.allocator,__child_stack,baseStorage,__arg._M_node);
    std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
    emplace_back<glslang::TObjectReflection>(this_00,(TObjectReflection *)&newBaseName);
    if (newBaseName._M_dataplus.super_allocator_type.allocator !=
        (TPoolAllocator *)&newBaseName._M_string_length) {
      operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                      newBaseName._M_string_length + 1);
    }
    if (newBaseName_1._M_dataplus.super_allocator_type.allocator !=
        (TPoolAllocator *)&newBaseName_1._M_string_length) {
      operator_delete(newBaseName_1._M_dataplus.super_allocator_type.allocator,
                      newBaseName_1._M_string_length + 1);
    }
    iVar10 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar10 != '\0') {
      iVar10 = getArrayStride(this,baseType,type);
      (this_00->
      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>).
      _M_impl.super__Vector_impl_data._M_finish[-1].arrayStride = iVar10;
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = iVar10;
      }
    }
    pTVar5 = this->reflection;
    EVar13 = pTVar5->options;
    if (((EVar13 & EShReflectionSeparateBuffers) != EShReflectionDefault) &&
       (type->field_0x8 == '\r')) {
      __position._M_current =
           (pTVar5->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pTVar5->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&pTVar5->atomicCounterUniformIndices,
                   __position,(int *)&newBaseName_2);
        EVar13 = this->reflection->options;
      }
      else {
        *__position._M_current = iVar9;
        (pTVar5->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    pTVar6 = (this_00->
             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pTVar6[-1].topLevelArraySize = topLevelArraySize;
    pTVar6[-1].topLevelArrayStride = topLevelArrayStride;
    if (!active || (EVar13 & EShReflectionAllBlockVariables) == EShReflectionDefault) {
      return;
    }
    pTVar6[-1].stages = pTVar6[-1].stages | 1 << ((char)this->intermediate->language & 0x1f);
    return;
  }
  iVar9 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar9 != '\0') {
    if (offset < 0) {
      iVar9 = 0;
    }
    else {
      iVar9 = getArrayStride(this,baseType,type);
    }
    uVar11 = (*type->_vptr_TType[0xf])(type);
    uVar21 = 1;
    if (1 < (int)uVar11) {
      uVar21 = uVar11;
    }
    if ((((EVar13 & EShReflectionStrictArraySuffix) != EShReflectionDefault) && (bVar25 != false))
       || ((uVar21 == topLevelArraySize && (topLevelArrayStride == 0)))) {
      uVar21 = 1;
    }
    if (topLevelArrayStride == 0) {
      topLevelArrayStride = iVar9;
    }
    uVar22 = 0;
    iVar10 = offset;
    do {
      newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&newBaseName_1,name._M_dataplus._M_p,
                          name._M_dataplus._M_p + name._M_string_length);
      iVar12 = (*type->_vptr_TType[7])(type);
      if (iVar12 != 0x10) {
        local_210._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_210,"[","");
        snprintf(text_1,0x10,"%d",uVar22);
        text._0_8_ = GetThreadPoolAllocator();
        text._8_8_ = local_f0;
        sVar18 = strlen(text_1);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)text,
                   text_1,text_1 + sVar18);
        pbVar19 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  _M_append(&local_210,(char *)text._8_8_,local_f8);
        newBaseName_2._M_dataplus.super_allocator_type.allocator =
             (pbVar19->_M_dataplus).super_allocator_type.allocator;
        newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
        pcVar3 = (pbVar19->_M_dataplus)._M_p;
        paVar1 = &pbVar19->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)pcVar3 == paVar1) {
          newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_2.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
        }
        else {
          newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_2._M_dataplus._M_p = pcVar3;
        }
        newBaseName_2._M_string_length = pbVar19->_M_string_length;
        (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar19->_M_string_length = 0;
        (pbVar19->field_2)._M_local_buf[0] = '\0';
        pbVar19 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                            (&newBaseName_2,"]");
        newBaseName._M_dataplus.super_allocator_type.allocator =
             (pbVar19->_M_dataplus).super_allocator_type.allocator;
        newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
        pcVar3 = (pbVar19->_M_dataplus)._M_p;
        paVar1 = &pbVar19->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)pcVar3 == paVar1) {
          newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
        }
        else {
          newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName._M_dataplus._M_p = pcVar3;
        }
        newBaseName._M_string_length = pbVar19->_M_string_length;
        (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar19->_M_string_length = 0;
        (pbVar19->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(&newBaseName_1,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
      }
      TType::TType((TType *)&newBaseName,type,0,false);
      if (-1 < iVar10) {
        iVar10 = offset;
      }
      blowUpActiveAggregate
                (this,(TType *)&newBaseName,&newBaseName_1,derefs,(const_iterator)deref_00,iVar10,
                 blockIndex,0,topLevelArraySize,topLevelArrayStride,baseStorage,active);
      uVar11 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar11;
      offset = offset + iVar9;
    } while (uVar21 != uVar11);
    return;
  }
  iVar9 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar9 != '\0') {
    pTVar17 = (type->field_13).referentType;
    local_210._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_210._M_dataplus._M_p = (pointer)0x0;
    local_210._M_string_length = 0;
    local_210.field_2._M_allocated_capacity = 0;
    if (-1 < offset) {
      std::vector<int,_glslang::pool_allocator<int>_>::resize
                ((vector<int,_glslang::pool_allocator<int>_> *)&local_210,
                 (long)(pTVar17->qualifier).semanticName - *(long *)&pTVar17->field_0x8 >> 5);
      getOffsets(this,type,(TVector<int> *)&local_210);
    }
    if ((int)((ulong)((long)(pTVar17->qualifier).semanticName - *(long *)&pTVar17->field_0x8) >> 5)
        < 1) {
      return;
    }
    local_1e4 = bVar25 - 1 | 1;
    lVar24 = 0;
    lVar23 = 0;
    local_268 = offset;
    do {
      newBaseName_2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&newBaseName_2,name._M_dataplus._M_p,
                          name._M_dataplus._M_p + name._M_string_length);
      if (newBaseName_2._M_string_length != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&newBaseName_2,".");
      }
      lVar15 = (**(code **)(**(long **)(*(long *)&pTVar17->field_0x8 + lVar24) + 0x30))();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(&newBaseName_2,*(char **)(lVar15 + 8),*(size_type *)(lVar15 + 0x10));
      TType::TType((TType *)&newBaseName,type,(int)lVar23,false);
      if (-1 < local_268) {
        local_268 = *(int *)(local_210._M_dataplus._M_p + lVar23 * 4) + offset;
      }
      iVar10 = (*type->_vptr_TType[7])(type);
      iVar9 = topLevelArrayStride;
      if (((iVar10 == 0x10) &&
          (iVar10 = (*type->_vptr_TType[0xb])(type),
          (*(uint *)(CONCAT44(extraout_var_00,iVar10) + 8) & 0x7f) == 6)) &&
         (local_140 != (TArraySizes *)0x0)) {
        iVar9 = getArrayStride(this,baseType,(TType *)&newBaseName);
      }
      if (topLevelArraySize == 0xffffffff && iVar9 == 0) {
        topLevelArraySize = local_1e4;
      }
      if (((byte)EVar13 & bVar25) == 0) {
        this_01 = (TType *)&newBaseName;
        iVar10 = local_268;
        uVar21 = topLevelArraySize;
        baseStorage_00 = baseStorage;
        bVar7 = active;
      }
      else {
        if (local_140 == (TArraySizes *)0x0) {
          iVar10 = *(int *)(local_210._M_dataplus._M_p + lVar23 * 4);
          iVar9 = (*type->_vptr_TType[0xb])(type);
          baseStorage_00 = *(TStorageQualifier *)(CONCAT44(extraout_var_02,iVar9) + 8) & 0x7f;
          this_01 = (TType *)&newBaseName;
          iVar9 = 0;
          uVar21 = 1;
        }
        else if ((byte)newBaseName._M_dataplus._M_p - 0xf < 2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&newBaseName_2,"[0]");
          cVar8 = (*(code *)newBaseName._M_dataplus.super_allocator_type.allocator[2].freeList)
                            (&newBaseName);
          if ((cVar8 == '\0') ||
             (uVar21 = TSmallArrayVector::frontSize(&local_140->sizes), uVar21 != 0)) {
            uVar21 = TSmallArrayVector::getDimSize(&local_140->sizes,0);
          }
          else {
            uVar21 = 0;
          }
          this_01 = (TType *)&newBaseName_1;
          TType::TType(this_01,(TType *)&newBaseName,0,false);
          local_1e8 = *(int *)(local_210._M_dataplus._M_p + lVar23 * 4);
          iVar10 = (*type->_vptr_TType[0xb])(type);
          baseStorage_00 = *(TStorageQualifier *)(CONCAT44(extraout_var_01,iVar10) + 8) & 0x7f;
          iVar10 = local_1e8;
        }
        else {
          cVar8 = (*(code *)newBaseName._M_dataplus.super_allocator_type.allocator[2].freeList)
                            (&newBaseName);
          if ((cVar8 == '\0') ||
             (uVar21 = TSmallArrayVector::frontSize(&local_140->sizes), uVar21 != 0)) {
            uVar21 = TSmallArrayVector::getDimSize(&local_140->sizes,0);
          }
          else {
            uVar21 = 0;
          }
          iVar10 = *(int *)(local_210._M_dataplus._M_p + lVar23 * 4);
          iVar9 = (*type->_vptr_TType[0xb])(type);
          baseStorage_00 = *(TStorageQualifier *)(CONCAT44(extraout_var_03,iVar9) + 8) & 0x7f;
          this_01 = (TType *)&newBaseName;
          iVar9 = 0;
        }
        bVar7 = false;
      }
      blowUpActiveAggregate
                (this,this_01,&newBaseName_2,derefs,(const_iterator)deref_00,iVar10,blockIndex,0,
                 uVar21,iVar9,baseStorage_00,bVar7);
      lVar23 = lVar23 + 1;
      lVar24 = lVar24 + 0x20;
    } while (lVar23 < (int)((ulong)((long)(pTVar17->qualifier).semanticName -
                                   *(long *)&pTVar17->field_0x8) >> 5));
    return;
  }
LAB_003750a7:
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
LAB_003748f3:
  newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &newBaseName,name._M_dataplus._M_p,
                      name._M_dataplus._M_p + name._M_string_length);
  iVar10 = (*type->_vptr_TType[7])(type);
  if (iVar10 != 0x10) {
    if ((EVar13 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
      iVar10 = (*baseType->_vptr_TType[7])();
      if (iVar10 != 0x10) goto LAB_0037499c;
    }
    else {
      if (bVar25 == false) {
LAB_0037499c:
        local_210._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_210,"[","");
        snprintf(text_1,0x10,"%d",uVar22);
        text._0_8_ = GetThreadPoolAllocator();
        text._8_8_ = local_f0;
        sVar18 = strlen(text_1);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)text,
                   text_1,text_1 + sVar18);
        pbVar19 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  _M_append(&local_210,(char *)text._8_8_,local_f8);
        newBaseName_2._M_dataplus.super_allocator_type.allocator =
             (pbVar19->_M_dataplus).super_allocator_type.allocator;
        newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
        pcVar3 = (pbVar19->_M_dataplus)._M_p;
        paVar1 = &pbVar19->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)pcVar3 == paVar1) {
          newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_2.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
        }
        else {
          newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_2._M_dataplus._M_p = pcVar3;
        }
        newBaseName_2._M_string_length = pbVar19->_M_string_length;
        (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar19->_M_string_length = 0;
        (pbVar19->field_2)._M_local_buf[0] = '\0';
        pbVar19 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                            (&newBaseName_2,"]");
        newBaseName_1._M_dataplus.super_allocator_type.allocator =
             (pbVar19->_M_dataplus).super_allocator_type.allocator;
        newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
        pcVar3 = (pbVar19->_M_dataplus)._M_p;
        paVar1 = &pbVar19->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
             *)pcVar3 == paVar1) {
          newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_1.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
        }
        else {
          newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          newBaseName_1._M_dataplus._M_p = pcVar3;
        }
        newBaseName_1._M_string_length = pbVar19->_M_string_length;
        (pbVar19->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar19->_M_string_length = 0;
        (pbVar19->field_2)._M_local_buf[0] = '\0';
      }
      else {
        newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &newBaseName_1,"[0]","");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(&newBaseName,newBaseName_1._M_dataplus._M_p,newBaseName_1._M_string_length);
    }
  }
  blowUpActiveAggregate
            (this,type,&newBaseName,derefs,(deref._M_node)->_M_next,offset,blockIndex,arraySize,
             topLevelArraySize,topLevelArrayStride,baseStorage,active);
  iVar10 = iVar9;
  if (offset < 0) {
    iVar10 = 0;
  }
  offset = offset + iVar10;
  uVar21 = (int)uVar22 + 1;
  uVar22 = (ulong)uVar21;
  plVar16 = (long *)(*(code *)p_Var4->_M_next[0x19]._M_next)(p_Var4);
  plVar16 = (long *)(**(code **)(*plVar16 + 0xf0))(plVar16);
  iVar10 = (**(code **)(*plVar16 + 0x78))(plVar16);
  if (iVar10 <= (int)uVar21) {
    return;
  }
  goto LAB_003748f3;
}

Assistant:

void blowUpActiveAggregate(const TType& baseType, const TString& baseName, const TList<TIntermBinary*>& derefs,
                               TList<TIntermBinary*>::const_iterator deref, int offset, int blockIndex, int arraySize,
                               int topLevelArraySize, int topLevelArrayStride, TStorageQualifier baseStorage, bool active)
    {
        // when strictArraySuffix is enabled, we closely follow the rules from ARB_program_interface_query.
        // Broadly:
        // * arrays-of-structs always have a [x] suffix.
        // * with array-of-struct variables in the root of a buffer block, only ever return [0].
        // * otherwise, array suffixes are added whenever we iterate, even if that means expanding out an array.
        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        // is this variable inside a buffer block. This flag is set back to false after we iterate inside the first array element.
        bool blockParent = (baseType.getBasicType() == EbtBlock && baseType.getQualifier().storage == EvqBuffer);

        // process the part of the dereference chain that was explicit in the shader
        TString name = baseName;
        const TType* terminalType = &baseType;
        for (; deref != derefs.end(); ++deref) {
            TIntermBinary* visitNode = *deref;
            terminalType = &visitNode->getType();
            int index;
            switch (visitNode->getOp()) {
            case EOpIndexIndirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // Visit all the indices of this array, and for each one add on the remaining dereferencing
                for (int i = 0; i < std::max(visitNode->getLeft()->getType().getOuterArraySize(), 1); ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() == EbtBlock) {}
                    else if (strictArraySuffix && blockParent)
                        newBaseName.append(TString("[0]"));
                    else if (strictArraySuffix || baseType.getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TList<TIntermBinary*>::const_iterator nextDeref = deref;
                    ++nextDeref;
                    blowUpActiveAggregate(*terminalType, newBaseName, derefs, nextDeref, offset, blockIndex, arraySize,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);

                    if (offset >= 0)
                        offset += stride;
                }

                // it was all completed in the recursive calls above
                return;
            }
            case EOpIndexDirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (terminalType->getBasicType() == EbtBlock) {}
                else if (strictArraySuffix && blockParent)
                    name.append(TString("[0]"));
                else if (strictArraySuffix || baseType.getBasicType() != EbtBlock) {
                    name.append(TString("[") + String(index) + "]");

                    if (offset >= 0)
                        offset += stride * index;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // expand top-level arrays in blocks with [0] suffix
                if (topLevelArrayStride != 0 && visitNode->getLeft()->getType().isArray()) {
                    blockParent = false;
                }
                break;
            }
            case EOpIndexDirectStruct:
                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (offset >= 0)
                    offset += intermediate.getOffset(visitNode->getLeft()->getType(), index);
                if (name.size() > 0)
                    name.append(".");
                name.append((*visitNode->getLeft()->getType().getStruct())[index].type->getFieldName());

                // expand non top-level arrays with [x] suffix
                if (visitNode->getLeft()->getType().getBasicType() != EbtBlock && terminalType->isArray())
                {
                    blockParent = false;
                }
                break;
            default:
                break;
            }
        }

        // if the terminalType is still too coarse a granularity, this is still an aggregate to expand, expand it...
        if (! isReflectionGranularity(*terminalType)) {
            // the base offset of this node, that children are relative to
            int baseOffset = offset;

            if (terminalType->isArray()) {
                // Visit all the indices of this array, and for each one,
                // fully explode the remaining aggregate to dereference

                int stride = 0;
                if (offset >= 0)
                    stride = getArrayStride(baseType, *terminalType);

                int arrayIterateSize = std::max(terminalType->getOuterArraySize(), 1);

                // for top-level arrays in blocks, only expand [0] to avoid explosion of items
                if ((strictArraySuffix && blockParent) ||
                    ((topLevelArraySize == arrayIterateSize) && (topLevelArrayStride == 0))) {
                    arrayIterateSize = 1;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                for (int i = 0; i < arrayIterateSize; ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TType derefType(*terminalType, 0);
                    if (offset >= 0)
                        offset = baseOffset + stride * i;

                    blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);
                }
            } else {
                // Visit all members of this aggregate, and for each one,
                // fully explode the remaining aggregate to dereference
                const TTypeList& typeList = *terminalType->getStruct();

                TVector<int> memberOffsets;

                if (baseOffset >= 0) {
                    memberOffsets.resize(typeList.size());
                    getOffsets(*terminalType, memberOffsets);
                }

                for (int i = 0; i < (int)typeList.size(); ++i) {
                    TString newBaseName = name;
                    if (newBaseName.size() > 0)
                        newBaseName.append(".");
                    newBaseName.append(typeList[i].type->getFieldName());
                    TType derefType(*terminalType, i);
                    if (offset >= 0)
                        offset = baseOffset + memberOffsets[i];

                    int arrayStride = topLevelArrayStride;
                    if (terminalType->getBasicType() == EbtBlock && terminalType->getQualifier().storage == EvqBuffer &&
                        derefType.isArray()) {
                        arrayStride = getArrayStride(baseType, derefType);
                    }

                    if (topLevelArraySize == -1 && arrayStride == 0 && blockParent)
                        topLevelArraySize = 1;

                    if (strictArraySuffix && blockParent) {
                        // if this member is an array, store the top-level array stride but start the explosion from
                        // the inner struct type.
                        if (derefType.isArray() && derefType.isStruct()) {
                            newBaseName.append("[0]");
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(TType(derefType, 0), newBaseName, derefs, derefs.end(), memberOffsets[i],
                                blockIndex, 0, dimSize, arrayStride, terminalType->getQualifier().storage, false);
                        }
                        else if (derefType.isArray()) {
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, dimSize, 0, terminalType->getQualifier().storage, false);
                        }
                        else {
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, 1, 0, terminalType->getQualifier().storage, false);
                        }
                    } else {
                        blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                              topLevelArraySize, arrayStride, baseStorage, active);
                    }
                }
            }

            // it was all completed in the recursive calls above
            return;
        }

        if ((reflection.options & EShReflectionBasicArraySuffix) && terminalType->isArray()) {
            name.append(TString("[0]"));
        }

        // Finally, add a full string to the reflection database, and update the array size if necessary.
        // If the dereferenced entity to record is an array, compute the size and update the maximum size.

        // there might not be a final array dereference, it could have been copied as an array object
        if (arraySize == 0)
            arraySize = mapToGlArraySize(*terminalType);

        TReflection::TMapIndexToReflection& variables = reflection.GetVariableMapForStorage(baseStorage);

        TReflection::TNameToIndex::const_iterator it = reflection.nameToIndex.find(name.c_str());
        if (it == reflection.nameToIndex.end()) {
            int uniformIndex = (int)variables.size();
            reflection.nameToIndex[name.c_str()] = uniformIndex;
            variables.push_back(TObjectReflection(name.c_str(), *terminalType, offset, mapToGlType(*terminalType),
                                                  arraySize, blockIndex));
            if (terminalType->isArray()) {
                variables.back().arrayStride = getArrayStride(baseType, *terminalType);
                if (topLevelArrayStride == 0)
                    topLevelArrayStride = variables.back().arrayStride;
            }

            if ((reflection.options & EShReflectionSeparateBuffers) && terminalType->isAtomic())
                reflection.atomicCounterUniformIndices.push_back(uniformIndex);

            variables.back().topLevelArraySize = topLevelArraySize;
            variables.back().topLevelArrayStride = topLevelArrayStride;
            
            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
                EShLanguageMask& stages = variables.back().stages;
                stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        } else {
            if (arraySize > 1) {
                int& reflectedArraySize = variables[it->second].size;
                reflectedArraySize = std::max(arraySize, reflectedArraySize);
            }

            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
              EShLanguageMask& stages = variables[it->second].stages;
              stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        }
    }